

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVec.cpp
# Opt level: O0

void __thiscall FeatureVec::FeatureVec(FeatureVec *this,size_t num_features,float initial_value)

{
  allocator_type *in_RSI;
  vector<float,_std::allocator<float>_> *this_00;
  size_type in_stack_ffffffffffffffb8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffc0;
  vector<float,_std::allocator<float>_> local_31;
  allocator_type *local_10;
  
  local_10 = in_RSI;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x104f4a);
  this_00 = &local_31;
  std::allocator<float>::allocator((allocator<float> *)0x104f63);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(value_type_conflict *)this_00,
             local_10);
  std::vector<float,_std::allocator<float>_>::operator=
            (this_00,(vector<float,_std::allocator<float>_> *)local_10);
  std::vector<float,_std::allocator<float>_>::~vector(this_00);
  std::allocator<float>::~allocator((allocator<float> *)0x104fa1);
  return;
}

Assistant:

FeatureVec::FeatureVec(size_t num_features, float initial_value) {
  values = std::vector<float>(num_features, initial_value);
}